

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O2

Keylet * __thiscall
jbcoin::keylet::offer_t::operator()
          (Keylet *__return_storage_ptr__,offer_t *this,AccountID *id,uint32_t seq)

{
  getOfferIndex(&__return_storage_ptr__->key,id,seq);
  __return_storage_ptr__->type = ltOFFER;
  return __return_storage_ptr__;
}

Assistant:

Keylet offer_t::operator()(AccountID const& id,
    std::uint32_t seq) const
{
    return { ltOFFER,
        getOfferIndex(id, seq) };
}